

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O0

common_ngram_cache * common_ngram_cache_load(string *filename)

{
  byte bVar1;
  bool bVar2;
  string *psVar3;
  long *plVar4;
  string *in_RSI;
  common_ngram_cache *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>,_bool> pVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>,_bool>
  pVar6;
  undefined1 auVar7 [12];
  int i;
  common_ngram_cache_part token_counts;
  char *countc;
  char *tokenc;
  char *ntokensc;
  char *ngramc;
  int32_t count;
  llama_token token;
  int32_t ntokens;
  common_ngram ngram;
  ifstream hashmap_file;
  common_ngram_cache *ngram_cache;
  _Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
  in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  _Node_iterator_base<std::pair<const_int,_int>,_false> in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined6 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  int local_2c4;
  int local_268;
  undefined1 local_264 [4];
  int local_260;
  common_ngram local_25c;
  undefined1 local_24a;
  undefined1 local_249;
  undefined4 local_224;
  undefined8 local_220;
  long local_218 [67];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    local_249 = 1;
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffcef,
                                    CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
                   in_stack_fffffffffffffce0);
    std::ios_base::failure[abi:cxx11]::failure(psVar3);
    local_249 = 0;
    __cxa_throw(psVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  local_24a = 0;
  std::
  unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  ::unordered_map((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   *)0x1105d5);
  common_ngram::common_ngram(&local_25c);
  while( true ) {
    plVar4 = (long *)std::istream::read((char *)local_218,(long)&local_25c);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar2) {
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0x100,"GGML_ASSERT(%s) failed","hashmap_file.eof()");
      }
      local_24a = 1;
      std::ifstream::~ifstream(local_218);
      return in_RDI;
    }
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) != 0) break;
    plVar4 = (long *)std::istream::read((char *)local_218,(long)&local_260);
    bVar1 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if ((bVar1 & 1) != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                 ,0xf1,"GGML_ASSERT(%s) failed","hashmap_file.read(ntokensc, sizeof(int32_t))");
    }
    if (local_260 < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                 ,0xf2,"GGML_ASSERT(%s) failed","ntokens > 0");
    }
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)0x110773);
    for (local_2c4 = 0; local_2c4 < local_260; local_2c4 = local_2c4 + 1) {
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) != 0) {
        auVar7 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                            ,0xf6,"GGML_ASSERT(%s) failed","!hashmap_file.eof()");
        local_224 = auVar7._8_4_;
        local_220 = auVar7._0_8_;
        std::
        unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)0x1107ff);
        auVar7._8_4_ = local_224;
        auVar7._0_8_ = local_220;
        goto LAB_00110a74;
      }
      plVar4 = (long *)std::istream::read((char *)local_218,(long)local_264);
      bVar1 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if ((bVar1 & 1) != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xf7,"GGML_ASSERT(%s) failed","hashmap_file.read(tokenc, sizeof(llama_token))");
      }
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xf8,"GGML_ASSERT(%s) failed","!hashmap_file.eof()");
      }
      plVar4 = (long *)std::istream::read((char *)local_218,(long)&local_268);
      bVar1 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if ((bVar1 & 1) != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xf9,"GGML_ASSERT(%s) failed","hashmap_file.read(countc, sizeof(int32_t))");
      }
      if (local_268 < 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xfa,"GGML_ASSERT(%s) failed","count > 0");
      }
      pVar5 = std::
              unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
              ::emplace<int&,int&>
                        ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)in_stack_fffffffffffffcb0._M_cur,
                         (int *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                         (int *)in_stack_fffffffffffffca0._M_cur);
      in_stack_fffffffffffffcb0._M_cur =
           (__node_type *)
           pVar5.first.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur;
      in_stack_fffffffffffffcaf = pVar5.second;
    }
    pVar6 = std::
            unordered_map<common_ngram,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>,common_ngram_hash_function,std::equal_to<common_ngram>,std::allocator<std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>>
            ::
            emplace<common_ngram&,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>&>
                      ((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                        *)in_stack_fffffffffffffcb0._M_cur,
                       (common_ngram *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8)
                       ,(unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffca0._M_cur);
    in_stack_fffffffffffffca0._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
         ._M_cur;
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)0x1109ed);
  }
  auVar7 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                      ,0xf0,"GGML_ASSERT(%s) failed","!hashmap_file.eof()");
LAB_00110a74:
  local_224 = auVar7._8_4_;
  local_220 = auVar7._0_8_;
  std::
  unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  ::~unordered_map((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                    *)0x110a7e);
  std::ifstream::~ifstream(local_218);
  _Unwind_Resume(local_220);
}

Assistant:

common_ngram_cache common_ngram_cache_load(std::string & filename) {
    std::ifstream hashmap_file(filename, std::ios::binary);
    if (!hashmap_file) {
        throw std::ifstream::failure("Unable to open file " + filename);
    }
    common_ngram_cache ngram_cache;

    common_ngram ngram;
    int32_t     ntokens;
    llama_token token;
    int32_t     count;

    char * ngramc   = reinterpret_cast<char*>(&ngram);
    char * ntokensc = reinterpret_cast<char*>(&ntokens);
    char * tokenc   = reinterpret_cast<char*>(&token);
    char * countc   = reinterpret_cast<char*>(&count);
    while(hashmap_file.read(ngramc, sizeof(common_ngram))) {
        GGML_ASSERT(!hashmap_file.eof());
        GGML_ASSERT(hashmap_file.read(ntokensc, sizeof(int32_t)));
        GGML_ASSERT(ntokens > 0);
        common_ngram_cache_part token_counts;

        for (int i = 0; i < ntokens; ++i) {
            GGML_ASSERT(!hashmap_file.eof());
            GGML_ASSERT(hashmap_file.read(tokenc, sizeof(llama_token)));
            GGML_ASSERT(!hashmap_file.eof());
            GGML_ASSERT(hashmap_file.read(countc, sizeof(int32_t)));
            GGML_ASSERT(count > 0);
            token_counts.emplace(token, count);
        }

        ngram_cache.emplace(ngram, token_counts);
    }
    GGML_ASSERT(hashmap_file.eof());

    return ngram_cache;
}